

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_split.hpp
# Opt level: O2

void __thiscall
RandomWordTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_>::~RandomWordTestData
          (RandomWordTestData<char16_t,_std::vector<char16_t,_std::allocator<char16_t>_>_> *this)

{
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&(this->m_token_indexes).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  std::
  vector<std::vector<char16_t,_std::allocator<char16_t>_>,_std::allocator<std::vector<char16_t,_std::allocator<char16_t>_>_>_>
  ::~vector(&this->m_tokens);
  std::_Vector_base<char16_t,_std::allocator<char16_t>_>::~_Vector_base
            (&(this->m_str).super__Vector_base<char16_t,_std::allocator<char16_t>_>);
  std::_Vector_base<char16_t,_std::allocator<char16_t>_>::~_Vector_base
            ((_Vector_base<char16_t,_std::allocator<char16_t>_> *)this);
  return;
}

Assistant:

RandomWordTestData(T in_delim = default_delim<T>, size_t in_fixed_word_count = 0, size_t in_fixed_word_length = 0)
		: m_fixed_word_count{ in_fixed_word_count },
		m_fixed_word_length{ in_fixed_word_length } {
		m_delim.insert(m_delim.end(), in_delim);
		populate();
	}